

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

string * __thiscall
pbrt::syntactic::ParamArray<bool>::toString_abi_cxx11_
          (string *__return_storage_ptr__,ParamArray<bool> *this)

{
  ostream *poVar1;
  ulong uVar2;
  stringstream ss;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  (**(this->super_Param)._vptr_Param)(&local_1d8,this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1d8,local_1d0)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[ ",2);
  if (((long)(this->super_vector<bool,_std::allocator<bool>_>).
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
             super__Bit_iterator_base._M_p -
      (long)(this->super_vector<bool,_std::allocator<bool>_>).
            super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
            super__Bit_iterator_base._M_p) * 8 +
      (ulong)(this->super_vector<bool,_std::allocator<bool>_>).
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
             super__Bit_iterator_base._M_offset != 0) {
    uVar2 = 0;
    do {
      poVar1 = std::ostream::_M_insert<bool>(SUB81(local_1a8,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)(this->super_vector<bool,_std::allocator<bool>_>).
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                     ((long)(this->super_vector<bool,_std::allocator<bool>_>).
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)(this->super_vector<bool,_std::allocator<bool>_>).
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string ParamArray<bool>::toString() const
    { 
      std::stringstream ss;
      ss << getType() << " ";
      ss << "[ ";
      for (size_t i=0;i<this->size();i++)
        ss << get(i) << " ";
      ss << "]";
      return ss.str();
    }